

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

void __thiscall SimpleConfiguration::insertSpin(SimpleConfiguration *this,bool spin,double tau)

{
  pair<bool,_double> local_18;
  
  local_18.first = spin;
  local_18.second = tau;
  std::vector<std::pair<bool,double>,std::allocator<std::pair<bool,double>>>::
  emplace_back<std::pair<bool,double>>
            ((vector<std::pair<bool,double>,std::allocator<std::pair<bool,double>>> *)this,&local_18
            );
  this->n = this->n + 1;
  return;
}

Assistant:

void insertSpin(bool spin, double tau) {
        c.push_back({spin, tau});
        ++n;
    }